

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O2

TestStatus *
vkt::synchronization::anon_unknown_0::testSemaphores
          (TestStatus *__return_storage_ptr__,Context *context)

{
  TestLog *pTVar1;
  void *pvVar2;
  VkDevice_s *device_00;
  VkResult VVar3;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkQueue queue;
  VkQueue queue_00;
  ostream *poVar4;
  NotSupportedError *this;
  uint *puVar5;
  ConstPixelBufferAccess *pCVar6;
  void *__buf;
  void *__buf_00;
  deUint32 queueFamilyIndex;
  long lVar7;
  allocator<char> local_e5a;
  allocator<char> local_e59;
  Move<vk::VkDevice_s_*> device;
  VkPipelineStageFlags waitDstStageMask;
  string local_e28;
  string local_e08;
  TextureFormat local_de8;
  ConstPixelBufferAccess local_de0;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_db8;
  float queuePriority [2];
  undefined1 local_d68 [8];
  DeviceInterface *pDStack_d60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d58 [23];
  VkMappedMemoryRange range;
  VkSubmitInfo submitInfo [2];
  TestContext testContext2;
  TestContext testContext1;
  Vec4 local_738;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  DeviceDriver deviceInterface;
  SimpleAllocator allocator;
  
  pTVar1 = context->m_testCtx->m_log;
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  queuePriority = (float  [2])&DAT_3f8000003f800000;
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             submitInfo,vk,physicalDevice);
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)&allocator,vk,physicalDevice);
  puVar5 = (uint *)(submitInfo[0]._0_8_ + 4);
  lVar7 = 0;
  while( true ) {
    if (((long)submitInfo[0].pNext - submitInfo[0]._0_8_) / 0x18 == lVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&deviceInterface);
      poVar4 = std::operator<<((ostream *)&deviceInterface,"Cannot create device with ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," graphics queues");
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      tcu::NotSupportedError::NotSupportedError(this,(string *)local_d68);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (((puVar5[-1] & 1) != 0) && (1 < *puVar5)) break;
    lVar7 = lVar7 + 1;
    puVar5 = puVar5 + 6;
  }
  testContext1.binaryCollection = (BinaryCollection *)&testContext2;
  testContext2.vkd = (DeviceInterface *)0xcdcdcdcd00000002;
  testContext2.device = (VkDevice)0x0;
  testContext1.renderDimension.m_data[0] = -0x32323233;
  testContext1.vkd = (DeviceInterface *)0xcdcdcdcd00000003;
  testContext1.device = (VkDevice)0x0;
  queueFamilyIndex = (deUint32)lVar7;
  testContext2._16_8_ = lVar7 << 0x20;
  testContext2.binaryCollection = (BinaryCollection *)0xcdcdcdcd00000002;
  testContext1.queueFamilyIndex = 0;
  testContext1._20_4_ = 1;
  testContext1.numVertices = 0;
  testContext2.allocator = (Allocator *)queuePriority;
  testContext1.renderDimension.m_data[1] = 0;
  testContext1._60_4_ = 0;
  testContext1.allocator = (Allocator *)0xcdcdcdcd00000000;
  testContext1.vertices = (Vec4 *)0x0;
  testContext1.fences[0].m_internal = (deUint64)&allocator;
  ::vk::createDevice(&device,vk,physicalDevice,(VkDeviceCreateInfo *)&testContext1,
                     (VkAllocationCallbacks *)0x0);
  std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
  ~_Vector_base((_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 *)submitInfo);
  ::vk::DeviceDriver::DeviceDriver
            (&deviceInterface,vk,device.super_RefBase<vk::VkDevice_s_*>.m_data.object);
  device_00 = device.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&testContext1,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&allocator,&deviceInterface.super_DeviceInterface,device_00,
             (VkPhysicalDeviceMemoryProperties *)&testContext1);
  queue = ::vk::getDeviceQueue
                    (&deviceInterface.super_DeviceInterface,
                     device.super_RefBase<vk::VkDevice_s_*>.m_data.object,queueFamilyIndex,0);
  queue_00 = ::vk::getDeviceQueue
                       (&deviceInterface.super_DeviceInterface,
                        device.super_RefBase<vk::VkDevice_s_*>.m_data.object,queueFamilyIndex,1);
  TestContext::TestContext
            (&testContext1,&deviceInterface.super_DeviceInterface,
             device.super_RefBase<vk::VkDevice_s_*>.m_data.object,queueFamilyIndex,
             context->m_progCollection,&allocator.super_Allocator);
  TestContext::TestContext
            (&testContext2,&deviceInterface.super_DeviceInterface,
             device.super_RefBase<vk::VkDevice_s_*>.m_data.object,queueFamilyIndex,
             context->m_progCollection,&allocator.super_Allocator);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)local_d68,
             &deviceInterface.super_DeviceInterface,
             device.super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
  local_db8.m_data.deleter.m_device = (VkDevice)local_d58[0]._0_8_;
  local_db8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_d58[0]._8_8_;
  local_db8.m_data.object.m_internal = (deUint64)local_d68;
  local_db8.m_data.deleter.m_deviceIface = pDStack_d60;
  local_d68 = (undefined1  [8])0x0;
  pDStack_d60 = (DeviceInterface *)0x0;
  local_d58[0]._M_allocated_capacity = (VkDevice)0x0;
  local_d58[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_d68);
  waitDstStageMask = 1;
  queuePriority[0] = 0.5;
  queuePriority[1] = 0.5;
  testContext2.vertices = &local_738;
  local_738.m_data[0] = -0.5;
  local_738.m_data[1] = -0.5;
  local_738.m_data[2] = 0.0;
  local_738.m_data[3] = 1.0;
  local_728 = 0xbf0000003f000000;
  uStack_720 = 0x3f80000000000000;
  local_718 = 0x3f00000000000000;
  uStack_710 = 0x3f80000000000000;
  testContext1.vertices = (Vec4 *)queuePriority;
  testContext2.numVertices = 3;
  testContext1.renderDimension.m_data[0] = 0x100;
  testContext1.renderDimension.m_data[1] = 0x100;
  testContext1.renderSize = 0x40000;
  testContext2.renderDimension.m_data[0] = 0x100;
  testContext2.renderDimension.m_data[1] = 0x100;
  testContext2.renderSize = 0x40000;
  testContext1.numVertices = testContext2.numVertices;
  createCommandBuffer(&deviceInterface.super_DeviceInterface,
                      device.super_RefBase<vk::VkDevice_s_*>.m_data.object,queueFamilyIndex,
                      &testContext1.cmdBuffer,&testContext1.commandPool);
  generateWork(&testContext1);
  createCommandBuffer(&deviceInterface.super_DeviceInterface,
                      device.super_RefBase<vk::VkDevice_s_*>.m_data.object,queueFamilyIndex,
                      &testContext2.cmdBuffer,&testContext2.commandPool);
  generateWork(&testContext2);
  initSubmitInfo(submitInfo,2);
  submitInfo[0].pSignalSemaphores = (VkSemaphore *)&local_db8;
  submitInfo[1].pWaitDstStageMask = &waitDstStageMask;
  submitInfo[0].pCommandBuffers = (VkCommandBuffer *)&testContext1.cmdBuffer;
  submitInfo[0].signalSemaphoreCount = 1;
  submitInfo[1].waitSemaphoreCount = 1;
  submitInfo[1].pWaitSemaphores = submitInfo[0].pSignalSemaphores;
  submitInfo[1].pCommandBuffers = (VkCommandBuffer *)&testContext2.cmdBuffer;
  VVar3 = ::vk::DeviceDriver::queueSubmit
                    (&deviceInterface,queue,1,submitInfo,testContext1.fences[0]);
  ::vk::checkResult(VVar3,
                    "deviceInterface.queueSubmit(queue[0], 1, &submitInfo[0], testContext1.fences[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                    ,0x494);
  VVar3 = ::vk::DeviceDriver::waitForFences
                    (&deviceInterface,device.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                     testContext1.fences,1,0xffffffffffffffff);
  if (VVar3 == VK_SUCCESS) {
    range.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
    range.pNext = (void *)0x0;
    range.memory.m_internal =
         ((testContext1.renderReadBuffer.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_memory).m_internal;
    range.offset = 0;
    range.size = testContext1.renderSize;
    VVar3 = ::vk::DeviceDriver::invalidateMappedMemoryRanges
                      (&deviceInterface,device.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                       &range);
    ::vk::checkResult(VVar3,"deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                      ,0x4a2);
    pvVar2 = (testContext1.renderReadBuffer.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e08,"result",&local_e59);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e28,"result",&local_e5a);
    local_de8.order = RGBA;
    local_de8.type = UNORM_INT8;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_de0,&local_de8,testContext1.renderDimension.m_data[0],
               testContext1.renderDimension.m_data[1],1,pvVar2);
    pCVar6 = &local_de0;
    tcu::LogImage::LogImage
              ((LogImage *)local_d68,&local_e08,&local_e28,pCVar6,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_d68,(int)pTVar1,__buf,(size_t)pCVar6);
    tcu::LogImage::~LogImage((LogImage *)local_d68);
    std::__cxx11::string::~string((string *)&local_e28);
    std::__cxx11::string::~string((string *)&local_e08);
    VVar3 = ::vk::DeviceDriver::queueSubmit
                      (&deviceInterface,queue_00,1,submitInfo + 1,testContext2.fences[0]);
    ::vk::checkResult(VVar3,
                      "deviceInterface.queueSubmit(queue[1], 1, &submitInfo[1], testContext2.fences[0])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                      ,0x4ae);
    VVar3 = ::vk::DeviceDriver::waitForFences
                      (&deviceInterface,device.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                       testContext2.fences,1,0xffffffffffffffff);
    if (VVar3 == VK_SUCCESS) {
      range.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
      range.pNext = (void *)0x0;
      range.memory.m_internal =
           ((testContext2.renderReadBuffer.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_memory).m_internal;
      range.offset = 0;
      range.size = testContext2.renderSize;
      VVar3 = ::vk::DeviceDriver::invalidateMappedMemoryRanges
                        (&deviceInterface,device.super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                         &range);
      ::vk::checkResult(VVar3,
                        "deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                        ,0x4bc);
      pvVar2 = (testContext2.renderReadBuffer.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e08,"result",&local_e59);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e28,"result",&local_e5a);
      local_de8.order = RGBA;
      local_de8.type = UNORM_INT8;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_de0,&local_de8,testContext2.renderDimension.m_data[0],
                 testContext2.renderDimension.m_data[1],1,pvVar2);
      pCVar6 = &local_de0;
      tcu::LogImage::LogImage
                ((LogImage *)local_d68,&local_e08,&local_e28,pCVar6,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_d68,(int)pTVar1,__buf_00,(size_t)pCVar6);
      tcu::LogImage::~LogImage((LogImage *)local_d68);
      std::__cxx11::string::~string((string *)&local_e28);
      std::__cxx11::string::~string((string *)&local_e08);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d68,"synchronization-semaphores passed",
                 (allocator<char> *)&local_de0);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_d68);
    }
    else {
      local_d68 = (undefined1  [8])pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_d60);
      std::operator<<((ostream *)&pDStack_d60,"testSynchPrimitives failed to wait for a set fence");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_d68,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_d60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d68,"failed to wait for a set fence",(allocator<char> *)&local_de0)
      ;
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_d68);
    }
  }
  else {
    local_d68 = (undefined1  [8])pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_d60);
    std::operator<<((ostream *)&pDStack_d60,"testSynchPrimitives failed to wait for a set fence");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_d68,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_d60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d68,"failed to wait for a set fence",(allocator<char> *)&local_de0);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_d68);
  }
  std::__cxx11::string::~string((string *)local_d68);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_db8);
  TestContext::~TestContext(&testContext2);
  TestContext::~TestContext(&testContext1);
  ::vk::DeviceDriver::~DeviceDriver(&deviceInterface);
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&device.super_RefBase<vk::VkDevice_s_*>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testSemaphores (Context& context)
{
	TestLog&					log					= context.getTestContext().getLog();
	const InstanceInterface&	instanceInterface	= context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice		= context.getPhysicalDevice();
	deUint32					queueFamilyIdx;
	vk::Move<VkDevice>			device				= createTestDevice(instanceInterface, physicalDevice, &queueFamilyIdx);
	const DeviceDriver			deviceInterface		(instanceInterface, *device);
	SimpleAllocator				allocator			(deviceInterface,
													 *device,
													 getPhysicalDeviceMemoryProperties(instanceInterface, physicalDevice));
	const VkQueue				queue[2]			=
	{
		getDeviceQueue(deviceInterface, *device, queueFamilyIdx, 0),
		getDeviceQueue(deviceInterface, *device, queueFamilyIdx, 1)
	};
	VkResult					testStatus;
	TestContext					testContext1		(deviceInterface, device.get(), queueFamilyIdx, context.getBinaryCollection(), allocator);
	TestContext					testContext2		(deviceInterface, device.get(), queueFamilyIdx, context.getBinaryCollection(), allocator);
	Unique<VkSemaphore>			semaphore			(createSemaphore(deviceInterface, *device));
	VkSubmitInfo				submitInfo[2];
	VkMappedMemoryRange			range;
	void*						resultImage;
	const VkPipelineStageFlags	waitDstStageMask	= VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT;

	const tcu::Vec4		vertices1[]			=
	{
		tcu::Vec4( 0.5f,  0.5f, 0.0f, 1.0f),
		tcu::Vec4(-0.5f,  0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, -0.5f, 0.0f, 1.0f)
	};

	const tcu::Vec4		vertices2[]			=
	{
		tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
	};

	testContext1.vertices			= vertices1;
	testContext1.numVertices		= DE_LENGTH_OF_ARRAY(vertices1);
	testContext1.renderDimension	= tcu::IVec2(256, 256);
	testContext1.renderSize			= sizeof(deUint32) * testContext1.renderDimension.x() * testContext1.renderDimension.y();

	testContext2.vertices			= vertices2;
	testContext2.numVertices		= DE_LENGTH_OF_ARRAY(vertices2);
	testContext2.renderDimension	= tcu::IVec2(256, 256);
	testContext2.renderSize			= sizeof(deUint32) * testContext2.renderDimension.x() * testContext2.renderDimension.y();

	createCommandBuffer(deviceInterface, device.get(), queueFamilyIdx, &testContext1.cmdBuffer, &testContext1.commandPool);
	generateWork(testContext1);

	createCommandBuffer(deviceInterface, device.get(), queueFamilyIdx, &testContext2.cmdBuffer, &testContext2.commandPool);
	generateWork(testContext2);

	initSubmitInfo(submitInfo, DE_LENGTH_OF_ARRAY(submitInfo));

	// The difference between the two submit infos is that each will use a unique cmd buffer,
	// and one will signal a semaphore but not wait on a semaphore, the other will wait on the
	// semaphore but not signal a semaphore
	submitInfo[0].pCommandBuffers		= &testContext1.cmdBuffer.get();
	submitInfo[1].pCommandBuffers		= &testContext2.cmdBuffer.get();

	submitInfo[0].signalSemaphoreCount	= 1;
	submitInfo[0].pSignalSemaphores		= &semaphore.get();
	submitInfo[1].waitSemaphoreCount	= 1;
	submitInfo[1].pWaitSemaphores		= &semaphore.get();
	submitInfo[1].pWaitDstStageMask		= &waitDstStageMask;

	VK_CHECK(deviceInterface.queueSubmit(queue[0], 1, &submitInfo[0], testContext1.fences[0]));

	testStatus  = deviceInterface.waitForFences(device.get(), 1, &testContext1.fences[0], true, std::numeric_limits<deUint64>::max());
	if (testStatus != VK_SUCCESS)
	{
		log << TestLog::Message << "testSynchPrimitives failed to wait for a set fence" << TestLog::EndMessage;
		return tcu::TestStatus::fail("failed to wait for a set fence");
	}

	range.sType			= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
	range.pNext			= DE_NULL;
	range.memory		= testContext1.renderReadBuffer->getMemory();
	range.offset		= 0;
	range.size			= testContext1.renderSize;
	VK_CHECK(deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range));
	resultImage = testContext1.renderReadBuffer->getHostPtr();

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
									testContext1.renderDimension.x(),
									testContext1.renderDimension.y(),
									1,
									resultImage));

	VK_CHECK(deviceInterface.queueSubmit(queue[1], 1, &submitInfo[1], testContext2.fences[0]));

	testStatus  = deviceInterface.waitForFences(device.get(), 1, &testContext2.fences[0], true, std::numeric_limits<deUint64>::max());
	if (testStatus != VK_SUCCESS)
	{
		log << TestLog::Message << "testSynchPrimitives failed to wait for a set fence" << TestLog::EndMessage;
		return tcu::TestStatus::fail("failed to wait for a set fence");
	}

	range.sType			= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
	range.pNext			= DE_NULL;
	range.memory		= testContext2.renderReadBuffer->getMemory();
	range.offset		= 0;
	range.size			= testContext2.renderSize;
	VK_CHECK(deviceInterface.invalidateMappedMemoryRanges(device.get(), 1, &range));
	resultImage = testContext2.renderReadBuffer->getHostPtr();

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
									testContext2.renderDimension.x(),
									testContext2.renderDimension.y(),
									1,
									resultImage));

	return tcu::TestStatus::pass("synchronization-semaphores passed");
}